

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<double> *value)

{
  bool bVar1;
  optional<double> local_40;
  double local_30;
  double v;
  optional<double> *local_20;
  optional<double> *value_local;
  AsciiParser *this_local;
  
  local_20 = value;
  value_local = (optional<double> *)this;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<double>::operator=(local_20);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,&local_30);
    if (bVar1) {
      nonstd::optional_lite::optional<double>::optional<double_&,_0>(&local_40,&local_30);
      nonstd::optional_lite::optional<double>::operator=(local_20,&local_40);
      nonstd::optional_lite::optional<double>::~optional(&local_40);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<double> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  double v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}